

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# earcut.hpp
# Opt level: O3

Node * __thiscall
mapbox::detail::Earcut<long>::
ObjectPool<mapbox::detail::Earcut<long>::Node,std::allocator<mapbox::detail::Earcut<long>::Node>>::
construct<long,double,double>
          (ObjectPool<mapbox::detail::Earcut<long>::Node,std::allocator<mapbox::detail::Earcut<long>::Node>>
           *this,long *args,double *args_1,double *args_2)

{
  double dVar1;
  double dVar2;
  Node *pNVar3;
  ulong uVar4;
  
  uVar4 = *(ulong *)(this + 8);
  if (*(ulong *)(this + 0x10) <= uVar4) {
    uVar4 = 0;
    pNVar3 = __gnu_cxx::new_allocator<mapbox::detail::Earcut<long>::Node>::allocate
                       ((new_allocator<mapbox::detail::Earcut<long>::Node> *)(this + 0x30),
                        *(ulong *)(this + 0x10),(void *)0x0);
    *(Node **)this = pNVar3;
    std::
    vector<mapbox::detail::Earcut<long>::Node*,std::allocator<mapbox::detail::Earcut<long>::Node*>>
    ::emplace_back<mapbox::detail::Earcut<long>::Node*&>
              ((vector<mapbox::detail::Earcut<long>::Node*,std::allocator<mapbox::detail::Earcut<long>::Node*>>
                *)(this + 0x18),(Node **)this);
  }
  *(ulong *)(this + 8) = uVar4 + 1;
  pNVar3 = (Node *)(*(long *)this + uVar4 * 0x48);
  dVar1 = *args_1;
  dVar2 = *args_2;
  pNVar3->i = *args;
  pNVar3->x = dVar1;
  pNVar3->y = dVar2;
  pNVar3->prev = (Node *)0x0;
  pNVar3->next = (Node *)0x0;
  pNVar3->z = 0;
  pNVar3->prevZ = (Node *)0x0;
  pNVar3->nextZ = (Node *)0x0;
  pNVar3->steiner = false;
  return pNVar3;
}

Assistant:

T* construct(Args&&... args) {
            if (currentIndex >= blockSize) {
                currentBlock = alloc.allocate(blockSize);
                allocations.emplace_back(currentBlock);
                currentIndex = 0;
            }
            T* object = &currentBlock[currentIndex++];
            alloc.construct(object, std::forward<Args>(args)...);
            return object;
        }